

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::BasicBuiltinVariables::Run(BasicBuiltinVariables *this)

{
  bool bVar1;
  long lVar2;
  uvec3 local_30;
  uvec3 local_24;
  
  local_24.m_data[0] = 0x40;
  local_24.m_data[1] = 1;
  local_24.m_data[2] = 1;
  local_30.m_data[0] = 8;
  local_30.m_data[1] = 1;
  local_30.m_data[2] = 1;
  bVar1 = RunIteration(this,&local_24,&local_30,false);
  lVar2 = -1;
  if (bVar1) {
    local_24.m_data._0_8_ = &DAT_100000001;
    local_24.m_data[2] = 0x40;
    local_30.m_data[0] = 1;
    local_30.m_data[1] = 5;
    local_30.m_data[2] = 2;
    bVar1 = RunIteration(this,&local_24,&local_30,true);
    if (bVar1) {
      local_24.m_data._0_8_ = &DAT_100000001;
      local_24.m_data[2] = 4;
      local_30.m_data[0] = 2;
      local_30.m_data[1] = 2;
      local_30.m_data[2] = 2;
      bVar1 = RunIteration(this,&local_24,&local_30,false);
      if (bVar1) {
        local_24.m_data[0] = 3;
        local_24.m_data[1] = 2;
        local_24.m_data[2] = 1;
        local_30.m_data[0] = 1;
        local_30.m_data[1] = 2;
        local_30.m_data[2] = 3;
        bVar1 = RunIteration(this,&local_24,&local_30,true);
        if (bVar1) {
          local_24.m_data[0] = 2;
          local_24.m_data[1] = 4;
          local_24.m_data[2] = 2;
          local_30.m_data[0] = 2;
          local_30.m_data[1] = 4;
          local_30.m_data[2] = 1;
          bVar1 = RunIteration(this,&local_24,&local_30,false);
          if (bVar1) {
            local_24.m_data[0] = 2;
            local_24.m_data[1] = 4;
            local_24.m_data[2] = 7;
            local_30.m_data[0] = 2;
            local_30.m_data[1] = 1;
            local_30.m_data[2] = 4;
            bVar1 = RunIteration(this,&local_24,&local_30,true);
            lVar2 = (ulong)bVar1 - 1;
          }
        }
      }
    }
  }
  return lVar2;
}

Assistant:

virtual long Run()
	{
		if (!RunIteration(uvec3(64, 1, 1), uvec3(8, 1, 1), false))
			return ERROR;
		if (!RunIteration(uvec3(1, 1, 64), uvec3(1, 5, 2), true))
			return ERROR;
		if (!RunIteration(uvec3(1, 1, 4), uvec3(2, 2, 2), false))
			return ERROR;
		if (!RunIteration(uvec3(3, 2, 1), uvec3(1, 2, 3), true))
			return ERROR;
		if (!RunIteration(uvec3(2, 4, 2), uvec3(2, 4, 1), false))
			return ERROR;
		if (!RunIteration(uvec3(2, 4, 7), uvec3(2, 1, 4), true))
			return ERROR;
		return NO_ERROR;
	}